

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O3

void __thiscall
glu::sl::ShaderParser::ShaderParser
          (ShaderParser *this,Archive *archive,string *filename,ShaderCaseFactory *caseFactroy)

{
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  
  this->m_archive = archive;
  (this->m_filename)._M_dataplus._M_p = (pointer)&(this->m_filename).field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_filename,pcVar1,pcVar1 + filename->_M_string_length);
  this->m_caseFactory = caseFactroy;
  iVar2 = (*archive->_vptr_Archive[2])(archive,(this->m_filename)._M_dataplus._M_p);
  (this->m_resource).super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data.ptr
       = (Resource *)CONCAT44(extraout_var,iVar2);
  (this->m_input).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_input).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_input).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->m_curPtr = (char *)0x0;
  this->m_curToken = TOKEN_LAST;
  (this->m_curTokenStr)._M_dataplus._M_p = (pointer)&(this->m_curTokenStr).field_2;
  (this->m_curTokenStr)._M_string_length = 0;
  (this->m_curTokenStr).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

ShaderParser::ShaderParser (const tcu::Archive& archive, const string& filename, ShaderCaseFactory* caseFactroy)
	: m_archive			(archive)
	, m_filename		(filename)
	, m_caseFactory		(caseFactroy)
	, m_resource		(archive.getResource(m_filename.c_str()))
	, m_curPtr			(DE_NULL)
	, m_curToken		(TOKEN_LAST)
{
}